

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O1

YV12_BUFFER_CONFIG *
av1_realloc_and_scale_if_required
          (AV1_COMMON *cm,YV12_BUFFER_CONFIG *unscaled,YV12_BUFFER_CONFIG *scaled,
          InterpFilter filter,int phase,_Bool use_optimized_scaler,_Bool for_psnr,
          int border_in_pixels,_Bool alloc_pyramid)

{
  uint8_t uVar1;
  uint32_t width;
  uint32_t height;
  int iVar2;
  int iVar3;
  int iVar4;
  SequenceHeader *pSVar5;
  _Bool _Var6;
  int iVar7;
  YV12_BUFFER_CONFIG *pYVar8;
  bool bVar9;
  bool bVar10;
  
  width = cm->buffer_removal_times[(ulong)for_psnr * 4 + -7];
  height = cm->buffer_removal_times[(ulong)for_psnr * 4 + -6];
  if ((width != (unscaled->field_2).field_0.y_crop_width) ||
     (pYVar8 = unscaled, height != (unscaled->field_3).field_0.y_crop_height)) {
    pSVar5 = cm->seq_params;
    uVar1 = pSVar5->monochrome;
    iVar7 = aom_realloc_frame_buffer
                      (scaled,width,height,pSVar5->subsampling_x,pSVar5->subsampling_y,
                       (uint)pSVar5->use_highbitdepth,border_in_pixels,(cm->features).byte_alignment
                       ,(aom_codec_frame_buffer_t *)0x0,(aom_get_frame_buffer_cb_fn_t)0x0,
                       (void *)0x0,alloc_pyramid,0);
    if (iVar7 != 0) {
      aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate scaled buffer");
    }
    iVar7 = (unscaled->field_2).field_0.y_crop_width;
    iVar2 = (unscaled->field_3).field_0.y_crop_height;
    if ((((((int)(height * 4) < iVar2 || (int)(width * 4) < iVar7) || (iVar7 * 0x10 < (int)width))
         || (iVar2 * 0x10 < (int)height)) ||
        (((int)(width << 4) % iVar7 != 0 || ((iVar7 * 0x10) % (int)width != 0)))) ||
       (((int)(height << 4) % iVar2 != 0 || ((iVar2 * 0x10) % (int)height != 0)))) {
      if (width * 4 + iVar7 * -3 == 0) {
        bVar9 = height * 4 + iVar2 * -3 == 0;
      }
      else {
        bVar9 = false;
      }
    }
    else {
      bVar9 = true;
    }
    bVar10 = (bool)(uVar1 != '\0' & bVar9);
    if ((uVar1 == '\0') && (bVar9)) {
      iVar7 = (unscaled->field_2).field_0.uv_crop_width;
      iVar2 = (unscaled->field_3).field_0.uv_crop_height;
      iVar3 = (scaled->field_2).field_0.uv_crop_width;
      iVar4 = (scaled->field_3).field_0.uv_crop_height;
      if (((iVar4 * 4 < iVar2 || iVar3 * 4 < iVar7) ||
          (((iVar7 * 0x10 < iVar3 || (iVar2 * 0x10 < iVar4)) || ((iVar3 << 4) % iVar7 != 0)))) ||
         ((((iVar7 * 0x10) % iVar3 != 0 || ((iVar4 << 4) % iVar2 != 0)) ||
          ((iVar2 * 0x10) % iVar4 != 0)))) {
        if (iVar3 * 4 + iVar7 * -3 == 0) {
          bVar10 = iVar4 * 4 + iVar2 * -3 == 0;
        }
        else {
          bVar10 = false;
        }
      }
      else {
        bVar10 = true;
      }
    }
    iVar7 = (uint)(uVar1 == '\0') * 2 + 1;
    if (((use_optimized_scaler) && (bVar10)) && (cm->seq_params->bit_depth == AOM_BITS_8)) {
      (*av1_resize_and_extend_frame)(unscaled,scaled,filter,phase,iVar7);
    }
    else {
      _Var6 = av1_resize_and_extend_frame_nonnormative
                        (unscaled,scaled,cm->seq_params->bit_depth,iVar7);
      if (!_Var6) {
        aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate buffers during resize")
        ;
      }
    }
    pYVar8 = scaled;
    if ((unscaled->metadata != (aom_metadata_array_t *)0x0) &&
       (iVar7 = aom_copy_metadata_to_frame_buffer(scaled,unscaled->metadata), iVar7 != 0)) {
      aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,
                         "Failed to copy source metadata to scaled frame");
    }
  }
  return pYVar8;
}

Assistant:

YV12_BUFFER_CONFIG *av1_realloc_and_scale_if_required(
    AV1_COMMON *cm, YV12_BUFFER_CONFIG *unscaled, YV12_BUFFER_CONFIG *scaled,
    const InterpFilter filter, const int phase, const bool use_optimized_scaler,
    const bool for_psnr, const int border_in_pixels, const bool alloc_pyramid) {
  // If scaling is performed for the sole purpose of calculating PSNR, then our
  // target dimensions are superres upscaled width/height. Otherwise our target
  // dimensions are coded width/height.
  const int scaled_width = for_psnr ? cm->superres_upscaled_width : cm->width;
  const int scaled_height =
      for_psnr ? cm->superres_upscaled_height : cm->height;
  const bool scaling_required = (scaled_width != unscaled->y_crop_width) ||
                                (scaled_height != unscaled->y_crop_height);

  if (scaling_required) {
    const int num_planes = av1_num_planes(cm);
    const SequenceHeader *seq_params = cm->seq_params;

    // Reallocate the frame buffer based on the target dimensions when scaling
    // is required.
    if (aom_realloc_frame_buffer(
            scaled, scaled_width, scaled_height, seq_params->subsampling_x,
            seq_params->subsampling_y, seq_params->use_highbitdepth,
            border_in_pixels, cm->features.byte_alignment, NULL, NULL, NULL,
            alloc_pyramid, 0))
      aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                         "Failed to allocate scaled buffer");

    bool has_optimized_scaler = av1_has_optimized_scaler(
        unscaled->y_crop_width, unscaled->y_crop_height, scaled_width,
        scaled_height);
    if (num_planes > 1) {
      has_optimized_scaler = has_optimized_scaler &&
                             av1_has_optimized_scaler(unscaled->uv_crop_width,
                                                      unscaled->uv_crop_height,
                                                      scaled->uv_crop_width,
                                                      scaled->uv_crop_height);
    }

#if CONFIG_AV1_HIGHBITDEPTH
    if (use_optimized_scaler && has_optimized_scaler &&
        cm->seq_params->bit_depth == AOM_BITS_8) {
      av1_resize_and_extend_frame(unscaled, scaled, filter, phase, num_planes);
    } else {
      if (!av1_resize_and_extend_frame_nonnormative(
              unscaled, scaled, (int)cm->seq_params->bit_depth, num_planes))
        aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                           "Failed to allocate buffers during resize");
    }
#else
    if (use_optimized_scaler && has_optimized_scaler) {
      av1_resize_and_extend_frame(unscaled, scaled, filter, phase, num_planes);
    } else {
      if (!av1_resize_and_extend_frame_nonnormative(
              unscaled, scaled, (int)cm->seq_params->bit_depth, num_planes))
        aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                           "Failed to allocate buffers during resize");
    }
#endif
    if (unscaled->metadata &&
        aom_copy_metadata_to_frame_buffer(scaled, unscaled->metadata)) {
      aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                         "Failed to copy source metadata to scaled frame");
    }
    return scaled;
  }
  return unscaled;
}